

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_mutable_descriptor_type
          (Impl *this,Value *state,VkMutableDescriptorTypeCreateInfoEXT **out_info)

{
  bool bVar1;
  SizeType SVar2;
  SizeType SVar3;
  VkDescriptorType VVar4;
  VkMutableDescriptorTypeCreateInfoEXT *pVVar5;
  Type this_00;
  VkMutableDescriptorTypeListEXT *pVVar6;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  VkDescriptorType *pVVar7;
  ValueIterator this_02;
  ValueIterator pGVar8;
  ulong uVar9;
  
  pVVar5 = ScratchAllocator::allocate_cleared<VkMutableDescriptorTypeCreateInfoEXT>
                     (&this->allocator);
  *out_info = pVVar5;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember(state,"mutableDescriptorTypeLists");
  if (bVar1) {
    this_00 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"mutableDescriptorTypeLists");
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Empty(this_00);
    if (!bVar1) {
      SVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::Size(this_00);
      pVVar6 = ScratchAllocator::allocate_n_cleared<VkMutableDescriptorTypeListEXT>
                         (&this->allocator,(ulong)SVar2);
      pVVar5->mutableDescriptorTypeListCount = SVar2;
      pVVar5->pMutableDescriptorTypeLists = pVVar6;
      for (uVar9 = 0; uVar9 != SVar2; uVar9 = uVar9 + 1) {
        this_01 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this_00,(SizeType)uVar9);
        SVar3 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Size(this_01);
        pVVar6[uVar9].descriptorTypeCount = SVar3;
        bVar1 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::Empty(this_01);
        if (!bVar1) {
          pVVar7 = ScratchAllocator::allocate_n<VkDescriptorType>(&this->allocator,(ulong)SVar3);
          pVVar6[uVar9].pDescriptorTypes = pVVar7;
          this_02 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::Begin(this_01);
          while( true ) {
            pGVar8 = rapidjson::
                     GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::End(this_01);
            if (this_02 == pGVar8) break;
            VVar4 = rapidjson::
                    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ::GetUint(this_02);
            *pVVar7 = VVar4;
            pVVar7 = pVVar7 + 1;
            this_02 = this_02 + 1;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_mutable_descriptor_type(const Value &state,
                                                        VkMutableDescriptorTypeCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkMutableDescriptorTypeCreateInfoEXT>();
	*out_info = info;

	if (!state.HasMember("mutableDescriptorTypeLists"))
		return true;

	auto &lists = state["mutableDescriptorTypeLists"];
	if (lists.Empty())
		return true;

	auto out_count = lists.Size();
	auto *out_lists = allocator.allocate_n_cleared<VkMutableDescriptorTypeListEXT>(out_count);

	info->mutableDescriptorTypeListCount = out_count;
	info->pMutableDescriptorTypeLists = out_lists;

	for (uint32_t i = 0; i < out_count; i++)
	{
		auto &list = lists[i];
		auto list_count = list.Size();
		out_lists[i].descriptorTypeCount = list_count;

		if (!list.Empty())
		{
			auto *desc_types = allocator.allocate_n<VkDescriptorType>(list_count);
			out_lists[i].pDescriptorTypes = desc_types;
			for (auto itr = list.Begin(); itr != list.End(); ++itr)
				*desc_types++ = static_cast<VkDescriptorType>(itr->GetUint());
		}
	}

	return true;
}